

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O0

FT_Error sfnt_get_charset_id(TT_Face face,char **acharset_encoding,char **acharset_registry)

{
  FT_Error local_44;
  undefined1 local_40 [4];
  FT_Error error;
  BDF_PropertyRec registry;
  BDF_PropertyRec encoding;
  char **acharset_registry_local;
  char **acharset_encoding_local;
  TT_Face face_local;
  
  local_44 = tt_face_find_bdf_prop(face,"CHARSET_REGISTRY",(BDF_PropertyRec *)local_40);
  if ((local_44 == 0) &&
     (local_44 = tt_face_find_bdf_prop(face,"CHARSET_ENCODING",(BDF_PropertyRec *)&registry.u),
     local_44 == 0)) {
    if ((local_40 == (undefined1  [4])0x1) && (registry.u.integer == 1)) {
      *acharset_encoding = (char *)encoding._0_8_;
      *acharset_registry = (char *)registry._0_8_;
    }
    else {
      local_44 = 6;
    }
  }
  return local_44;
}

Assistant:

static FT_Error
  sfnt_get_charset_id( TT_Face       face,
                       const char*  *acharset_encoding,
                       const char*  *acharset_registry )
  {
    BDF_PropertyRec  encoding, registry;
    FT_Error         error;


    /* XXX: I don't know whether this is correct, since
     *      tt_face_find_bdf_prop only returns something correct if we have
     *      previously selected a size that is listed in the BDF table.
     *      Should we change the BDF table format to include single offsets
     *      for `CHARSET_REGISTRY' and `CHARSET_ENCODING'?
     */
    error = tt_face_find_bdf_prop( face, "CHARSET_REGISTRY", &registry );
    if ( !error )
    {
      error = tt_face_find_bdf_prop( face, "CHARSET_ENCODING", &encoding );
      if ( !error )
      {
        if ( registry.type == BDF_PROPERTY_TYPE_ATOM &&
             encoding.type == BDF_PROPERTY_TYPE_ATOM )
        {
          *acharset_encoding = encoding.u.atom;
          *acharset_registry = registry.u.atom;
        }
        else
          error = FT_THROW( Invalid_Argument );
      }
    }

    return error;
  }